

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsEndpointAddSourceFilter(HelicsEndpoint end,char *filterName,HelicsError *err)

{
  Endpoint *this;
  EndpointObject *pEVar1;
  size_t sVar2;
  string_view filterName_00;
  
  pEVar1 = anon_unknown.dwarf_8bada::verifyEndpoint(end,err);
  if (pEVar1 != (EndpointObject *)0x0) {
    this = pEVar1->endPtr;
    sVar2 = strlen(filterName);
    filterName_00._M_str = filterName;
    filterName_00._M_len = sVar2;
    helics::Endpoint::addSourceFilter(this,filterName_00);
  }
  return;
}

Assistant:

void helicsEndpointAddSourceFilter(HelicsEndpoint end, const char* filterName, HelicsError* err)
{
    auto* endObj = verifyEndpoint(end, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->addSourceFilter(filterName);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}